

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O1

GLboolean glewGetExtension(char *name)

{
  GLboolean GVar1;
  GLubyte *start;
  uint uVar2;
  ulong uVar3;
  
  start = (GLubyte *)glGetString(0x1f03);
  if (start != (GLubyte *)0x0) {
    uVar3 = 0xffffffff;
    do {
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while (start[uVar3] != '\0');
    GVar1 = _glewSearchExtension(name,start,start + uVar2);
    return GVar1;
  }
  return '\0';
}

Assistant:

GLboolean GLEWAPIENTRY glewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;
  start = (const GLubyte*)glGetString(GL_EXTENSIONS);
  if (start == 0)
    return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}